

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

optional<Token> * __thiscall
Analyser::nextToken(optional<Token> *__return_storage_ptr__,Analyser *this)

{
  ulong uVar1;
  pointer pTVar2;
  
  uVar1 = this->_offset;
  pTVar2 = (this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar1 < (ulong)((long)(this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 5)) {
    this->_currentLine = (int32_t)pTVar2[uVar1]._lineNumber;
    this->_offset = uVar1 + 1;
    std::_Optional_payload_base<Token>::_Optional_payload_base<Token&>
              ((_Optional_payload_base<Token> *)__return_storage_ptr__,pTVar2 + uVar1);
  }
  else {
    this->_offset = uVar1 + 1;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<Token> Analyser::nextToken() {
	if (_offset >= _tokens.size()) {
		_offset++;
		return {};
	}

	_currentLine = _tokens[_offset].GetLine();
	return _tokens[_offset++];
}